

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *scale,
          Pixel *tint)

{
  float fVar1;
  float fVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 local_78 [8];
  vf2d local_70;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  vf2d local_50;
  float local_48;
  vf2d local_44;
  vf2d vStack_3c;
  undefined8 local_34;
  float afStack_2c [3];
  anon_union_4_2_12391da5_for_Pixel_0 local_20;
  anon_union_4_2_12391da5_for_Pixel_0 local_1c;
  anon_union_4_2_12391da5_for_Pixel_0 local_18;
  anon_union_4_2_12391da5_for_Pixel_0 local_14;
  
  local_48 = 0.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_44.x = 1.0;
  local_44.y = 1.0;
  vStack_3c.x = 1.0;
  vStack_3c.y = 1.0;
  local_34._0_4_ = 0.0;
  local_34._4_4_ = 1.0;
  afStack_2c[0] = 1.0;
  afStack_2c[1] = 1.0;
  afStack_2c[2] = 1.0;
  local_1c = WHITE;
  local_18 = WHITE;
  local_14 = WHITE;
  local_20.field_1 =
       *(anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1 *)&tint->field_0;
  fVar6 = (*center).x;
  fVar7 = (*center).y;
  local_60 = (*scale).x;
  local_68 = (0.0 - fVar6) * local_60;
  local_64 = (*scale).y;
  local_54 = (0.0 - fVar7) * local_64;
  local_70.y = local_54;
  local_70.x = local_68;
  local_64 = local_64 * ((float)decal->sprite->height - fVar7);
  local_60 = ((float)decal->sprite->width - fVar6) * local_60;
  local_78 = (undefined1  [8])decal;
  local_5c = local_64;
  local_58 = local_60;
  dVar4 = cos((double)fAngle);
  dVar5 = sin((double)fAngle);
  fVar6 = pos->x;
  fVar7 = pos->y;
  fVar1 = (this->vInvScreenSize).x;
  fVar2 = (this->vInvScreenSize).y;
  for (lVar3 = 1; lVar3 != 5; lVar3 = lVar3 + 1) {
    fVar9 = ((*(float *)(local_78 + lVar3 * 8) * (float)dVar4 -
             (float)dVar5 * *(float *)(local_78 + lVar3 * 8 + 4)) + fVar6) * fVar1;
    fVar8 = (*(float *)(local_78 + lVar3 * 8) * (float)dVar5 +
             *(float *)(local_78 + lVar3 * 8 + 4) * (float)dVar4 + fVar7) * fVar2;
    *(float *)(local_78 + lVar3 * 8) = fVar9 + fVar9 + -1.0;
    *(float *)(local_78 + lVar3 * 8 + 4) = -(fVar8 + fVar8 + -1.0);
  }
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             (value_type *)local_78);
  return;
}

Assistant:

v2d_generic(T _x, T _y) : x(_x), y(_y) {}